

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

Column_metadata * __thiscall
sqlite::Connection::table_column_metadata
          (Column_metadata *__return_storage_ptr__,Connection *this,string *table_name,
          string *column_name,string *db_name)

{
  int sqlite_error_code;
  Runtime_error *this_00;
  char *__rhs;
  allocator local_14d;
  int auto_inc;
  int primary_key;
  int not_null;
  char *collation;
  char *type;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sqlite_error_code =
       sqlite3_table_column_metadata
                 (this->db_,(db_name->_M_dataplus)._M_p,(table_name->_M_dataplus)._M_p,
                  (column_name->_M_dataplus)._M_p,&type,&collation,&not_null,&primary_key,&auto_inc)
  ;
  if (sqlite_error_code == 0) {
    Column_metadata::Column_metadata(__return_storage_ptr__);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    std::__cxx11::string::assign((char *)&__return_storage_ptr__->collation);
    __return_storage_ptr__->not_null = not_null != 0;
    __return_storage_ptr__->primary_key = primary_key != 0;
    __return_storage_ptr__->auto_inc = auto_inc != 0;
    return __return_storage_ptr__;
  }
  sqlite3_close(this->db_);
  this_00 = (Runtime_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_110,"Error getting column info (",db_name);
  std::operator+(&local_f0,&local_110,".");
  std::operator+(&local_d0,&local_f0,table_name);
  std::operator+(&local_b0,&local_d0,".");
  std::operator+(&local_90,&local_b0,column_name);
  std::operator+(&local_70,&local_90,"): ");
  __rhs = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_50,&local_70,__rhs);
  std::__cxx11::string::string((string *)&local_130,"",&local_14d);
  Runtime_error::Runtime_error(this_00,&local_50,&local_130,sqlite_error_code,(sqlite3 *)0x0);
  __cxa_throw(this_00,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
}

Assistant:

Connection::Column_metadata Connection::table_column_metadata(const std::string & table_name, const std::string & column_name,
        const std::string & db_name)
    {
        const char * type, * collation;
        int not_null, primary_key, auto_inc;

        int status = sqlite3_table_column_metadata(db_, db_name.c_str(), table_name.c_str(), column_name.c_str(),
            &type, &collation, &not_null, &primary_key, &auto_inc);

        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error getting column info (" +
                db_name + "." + table_name + "." + column_name + "): " +
                sqlite3_errmsg(db_), "", status, nullptr);
        }

        Column_metadata ret;
        ret.type = type;
        ret.collation = collation;
        ret.not_null = bool(not_null);
        ret.primary_key = bool(primary_key);
        ret.auto_inc = bool(auto_inc);

        return ret;
    }